

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegenerator.h
# Opt level: O0

string * cg_default_value_for_type(string *__return_storage_ptr__,string *type)

{
  bool bVar1;
  long lVar2;
  allocator local_3c;
  allocator local_3b;
  allocator local_3a;
  allocator local_39;
  allocator local_38;
  allocator local_37;
  allocator local_36;
  allocator local_35;
  allocator local_34;
  allocator local_33;
  allocator local_32;
  allocator local_31;
  allocator local_30;
  allocator local_2f;
  allocator local_2e;
  allocator local_2d [20];
  allocator local_19;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_18;
  string *type_local;
  
  local_18 = type;
  type_local = __return_storage_ptr__;
  bVar1 = std::operator==(type,"bool");
  if (bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)__return_storage_ptr__,"false",&local_19);
    std::allocator<char>::~allocator((allocator<char> *)&local_19);
  }
  else {
    bVar1 = std::operator==(local_18,"boolean");
    if (bVar1) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)__return_storage_ptr__,"false",local_2d);
      std::allocator<char>::~allocator((allocator<char> *)local_2d);
    }
    else {
      bVar1 = std::operator==(local_18,"char");
      if (bVar1) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)__return_storage_ptr__,"0",&local_2e);
        std::allocator<char>::~allocator((allocator<char> *)&local_2e);
      }
      else {
        bVar1 = std::operator==(local_18,"unsigned char");
        if (bVar1) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string((string *)__return_storage_ptr__,"0",&local_2f);
          std::allocator<char>::~allocator((allocator<char> *)&local_2f);
        }
        else {
          bVar1 = std::operator==(local_18,"short");
          if (bVar1) {
            std::allocator<char>::allocator();
            std::__cxx11::string::string((string *)__return_storage_ptr__,"0",&local_30);
            std::allocator<char>::~allocator((allocator<char> *)&local_30);
          }
          else {
            bVar1 = std::operator==(local_18,"unsigned short");
            if (bVar1) {
              std::allocator<char>::allocator();
              std::__cxx11::string::string((string *)__return_storage_ptr__,"0",&local_31);
              std::allocator<char>::~allocator((allocator<char> *)&local_31);
            }
            else {
              bVar1 = std::operator==(local_18,"int");
              if (bVar1) {
                std::allocator<char>::allocator();
                std::__cxx11::string::string((string *)__return_storage_ptr__,"0",&local_32);
                std::allocator<char>::~allocator((allocator<char> *)&local_32);
              }
              else {
                bVar1 = std::operator==(local_18,"unsigned int");
                if (bVar1) {
                  std::allocator<char>::allocator();
                  std::__cxx11::string::string((string *)__return_storage_ptr__,"0",&local_33);
                  std::allocator<char>::~allocator((allocator<char> *)&local_33);
                }
                else {
                  bVar1 = std::operator==(local_18,"unsigned");
                  if (bVar1) {
                    std::allocator<char>::allocator();
                    std::__cxx11::string::string((string *)__return_storage_ptr__,"0",&local_34);
                    std::allocator<char>::~allocator((allocator<char> *)&local_34);
                  }
                  else {
                    bVar1 = std::operator==(local_18,"long");
                    if (bVar1) {
                      std::allocator<char>::allocator();
                      std::__cxx11::string::string((string *)__return_storage_ptr__,"0",&local_35);
                      std::allocator<char>::~allocator((allocator<char> *)&local_35);
                    }
                    else {
                      bVar1 = std::operator==(local_18,"unsigned long");
                      if (bVar1) {
                        std::allocator<char>::allocator();
                        std::__cxx11::string::string((string *)__return_storage_ptr__,"0",&local_36)
                        ;
                        std::allocator<char>::~allocator((allocator<char> *)&local_36);
                      }
                      else {
                        bVar1 = std::operator==(local_18,"long long");
                        if (bVar1) {
                          std::allocator<char>::allocator();
                          std::__cxx11::string::string
                                    ((string *)__return_storage_ptr__,"0",&local_37);
                          std::allocator<char>::~allocator((allocator<char> *)&local_37);
                        }
                        else {
                          bVar1 = std::operator==(local_18,"unsigned long long");
                          if (bVar1) {
                            std::allocator<char>::allocator();
                            std::__cxx11::string::string
                                      ((string *)__return_storage_ptr__,"0",&local_38);
                            std::allocator<char>::~allocator((allocator<char> *)&local_38);
                          }
                          else {
                            bVar1 = std::operator==(local_18,"float");
                            if (bVar1) {
                              std::allocator<char>::allocator();
                              std::__cxx11::string::string
                                        ((string *)__return_storage_ptr__,"0.0f",&local_39);
                              std::allocator<char>::~allocator((allocator<char> *)&local_39);
                            }
                            else {
                              bVar1 = std::operator==(local_18,"double");
                              if (bVar1) {
                                std::allocator<char>::allocator();
                                std::__cxx11::string::string
                                          ((string *)__return_storage_ptr__,"0.0",&local_3a);
                                std::allocator<char>::~allocator((allocator<char> *)&local_3a);
                              }
                              else {
                                lVar2 = std::__cxx11::string::find((char *)local_18,0x14ebf2);
                                if (lVar2 == -1) {
                                  std::allocator<char>::allocator();
                                  std::__cxx11::string::string
                                            ((string *)__return_storage_ptr__,"",&local_3c);
                                  std::allocator<char>::~allocator((allocator<char> *)&local_3c);
                                }
                                else {
                                  std::allocator<char>::allocator();
                                  std::__cxx11::string::string
                                            ((string *)__return_storage_ptr__,"nullptr",&local_3b);
                                  std::allocator<char>::~allocator((allocator<char> *)&local_3b);
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return __return_storage_ptr__;
}

Assistant:

inline std::string cg_default_value_for_type(const std::string &type)
{
    if (type == "bool") return "false";
    else if (type == "boolean") return "false";
    else if (type == "char") return "0";
    else if (type == "unsigned char") return "0";
    else if (type == "short") return "0";
    else if (type == "unsigned short") return "0";
    else if (type == "int") return "0";
    else if (type == "unsigned int") return "0";
    else if (type == "unsigned") return "0";
    else if (type == "long") return "0";
    else if (type == "unsigned long") return "0";
    else if (type == "long long") return "0";
    else if (type == "unsigned long long") return "0";
    else if (type == "float") return "0.0f";
    else if (type == "double") return "0.0";
    else if (type.find("*") != std::string::npos) return "nullptr";
    return "";
}